

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_common.c
# Opt level: O2

EGLDisplay get_egl_display_or_skip(void)

{
  int iVar1;
  long lVar2;
  EGLDisplay pvVar3;
  char *pcVar4;
  undefined8 uStack_20;
  EGLint minor;
  EGLint major;
  
  lVar2 = XOpenDisplay(0);
  if (lVar2 == 0) {
    pcVar4 = "couldn\'t open display\n";
    uStack_20 = 0x4d;
  }
  else {
    pvVar3 = (EGLDisplay)(*_epoxy_eglGetDisplay)(lVar2);
    if (pvVar3 == (EGLDisplay)0x0) {
      pcVar4 = "Couldn\'t get EGL display for X11 Display.\n";
    }
    else {
      iVar1 = (*_epoxy_eglInitialize)(pvVar3,&major,&minor);
      if (iVar1 != 0) {
        return pvVar3;
      }
      pcVar4 = "eglInitialize() failed\n";
    }
    uStack_20 = 1;
  }
  errx(uStack_20,pcVar4);
  pvVar3 = (EGLDisplay)XOpenDisplay(0);
  if (pvVar3 != (EGLDisplay)0x0) {
    return pvVar3;
  }
  fwrite("couldn\'t open display\n",0x16,1,_stderr);
  exit(0x4d);
}

Assistant:

EGLDisplay 
get_egl_display_or_skip(void)
{
    Display *dpy = XOpenDisplay(NULL);
    EGLint major, minor;
    EGLDisplay edpy;
    bool ok;

    if (!dpy)
        errx(77, "couldn't open display\n");
    edpy = eglGetDisplay((EGLNativeDisplayType)dpy);
    if (edpy == EGL_NO_DISPLAY)
        errx(1, "Couldn't get EGL display for X11 Display.\n");

    ok = eglInitialize(edpy, &major, &minor);
    if (!ok)
        errx(1, "eglInitialize() failed\n");

    return edpy;
}